

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

void __thiscall
rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::Queue
          (Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> *this,size_t capacity,
          allocator<rigtorp::mpmc::Slot<TestType>_> *allocator)

{
  invalid_argument *this_00;
  Slot<TestType> *pSVar1;
  bad_alloc *this_01;
  ulong local_38;
  size_t i;
  allocator<rigtorp::mpmc::Slot<TestType>_> *allocator_local;
  size_t capacity_local;
  Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> *this_local;
  
  this->capacity_ = capacity;
  std::allocator<rigtorp::mpmc::Slot<TestType>_>::allocator
            ((allocator<rigtorp::mpmc::Slot<TestType>_> *)this,allocator);
  std::atomic<unsigned_long>::atomic(&this->head_,0);
  std::atomic<unsigned_long>::atomic(&this->tail_,0);
  if (this->capacity_ == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"capacity < 1");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pSVar1 = __gnu_cxx::new_allocator<rigtorp::mpmc::Slot<TestType>_>::allocate
                     ((new_allocator<rigtorp::mpmc::Slot<TestType>_> *)this,this->capacity_ + 1,
                      (void *)0x0);
  this->slots_ = pSVar1;
  if (((ulong)this->slots_ & 0x3f) != 0) {
    __gnu_cxx::new_allocator<rigtorp::mpmc::Slot<TestType>_>::deallocate
              ((new_allocator<rigtorp::mpmc::Slot<TestType>_> *)this,this->slots_,
               this->capacity_ + 1);
    this_01 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_01);
    __cxa_throw(this_01,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  for (local_38 = 0; local_38 < this->capacity_; local_38 = local_38 + 1) {
    pSVar1 = this->slots_;
    memset(pSVar1 + local_38,0,0xc0);
    Slot<TestType>::Slot(pSVar1 + local_38);
  }
  return;
}

Assistant:

explicit Queue(const size_t capacity,
                 const Allocator &allocator = Allocator())
      : capacity_(capacity), allocator_(allocator), head_(0), tail_(0) {
    if (capacity_ < 1) {
      throw std::invalid_argument("capacity < 1");
    }
    // Allocate one extra slot to prevent false sharing on the last slot
    slots_ = allocator_.allocate(capacity_ + 1);
    // Allocators are not required to honor alignment for over-aligned types
    // (see http://eel.is/c++draft/allocator.requirements#10) so we verify
    // alignment here
    if (reinterpret_cast<size_t>(slots_) % alignof(Slot<T>) != 0) {
      allocator_.deallocate(slots_, capacity_ + 1);
      throw std::bad_alloc();
    }
    for (size_t i = 0; i < capacity_; ++i) {
      new (&slots_[i]) Slot<T>();
    }
    static_assert(
        alignof(Slot<T>) == hardwareInterferenceSize,
        "Slot must be aligned to cache line boundary to prevent false sharing");
    static_assert(sizeof(Slot<T>) % hardwareInterferenceSize == 0,
                  "Slot size must be a multiple of cache line size to prevent "
                  "false sharing between adjacent slots");
    static_assert(sizeof(Queue) % hardwareInterferenceSize == 0,
                  "Queue size must be a multiple of cache line size to "
                  "prevent false sharing between adjacent queues");
    static_assert(
        offsetof(Queue, tail_) - offsetof(Queue, head_) ==
            static_cast<std::ptrdiff_t>(hardwareInterferenceSize),
        "head and tail must be a cache line apart to prevent false sharing");
  }